

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QString,long_long&,int&,int&>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,QString *args,longlong *args_1
          ,int *args_2,int *args_3)

{
  Data **ppDVar1;
  Data *pDVar2;
  int iVar3;
  int iVar4;
  Data *pDVar5;
  long lVar6;
  longlong lVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  Data *pDVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar5 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.d;
  if ((pDVar5 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar6 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc - lVar6 !=
        ((long)((long)(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                      super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pDVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
      lVar7 = *args_1;
      iVar3 = *args_2;
      iVar4 = *args_3;
      pDVar8 = (args->d).d;
      pDVar11[lVar6].abbreviation.d.d = pDVar8;
      pDVar11[lVar6].abbreviation.d.ptr = (args->d).ptr;
      pDVar11[lVar6].abbreviation.d.size = (args->d).size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11[lVar6].atMSecsSinceEpoch = lVar7;
      pDVar11[lVar6].offsetFromUtc = iVar3;
      pDVar11[lVar6].standardTimeOffset = iVar4;
      pDVar11[lVar6].daylightTimeOffset = iVar3 - iVar4;
      goto LAB_00410172;
    }
    if (((i == 0) && (pDVar5 != (Data *)0x0)) &&
       ((Data *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
        (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
        super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr)) {
      pDVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
      lVar7 = *args_1;
      iVar3 = *args_2;
      iVar4 = *args_3;
      pDVar8 = (args->d).d;
      pDVar11[-1].abbreviation.d.d = pDVar8;
      pDVar11[-1].abbreviation.d.ptr = (args->d).ptr;
      pDVar11[-1].abbreviation.d.size = (args->d).size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11[-1].atMSecsSinceEpoch = lVar7;
      pDVar11[-1].offsetFromUtc = iVar3;
      pDVar11[-1].standardTimeOffset = iVar4;
      pDVar11[-1].daylightTimeOffset = iVar3 - iVar4;
      ppDVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
      *ppDVar1 = *ppDVar1 + -1;
      goto LAB_00410172;
    }
  }
  lVar7 = *args_1;
  iVar3 = *args_2;
  iVar4 = *args_3;
  pDVar8 = (args->d).d;
  pcVar9 = (args->d).ptr;
  qVar10 = (args->d).size;
  if (pDVar8 != (Data *)0x0) {
    LOCK();
    (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar13 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.size != 0;
  QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
            ((QArrayDataPointer<QTimeZonePrivate::Data> *)this,(uint)(i == 0 && bVar13),1,
             (Data **)0x0,(QArrayDataPointer<QTimeZonePrivate::Data> *)0x0);
  pDVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
  if (i == 0 && bVar13) {
    pDVar11[-1].abbreviation.d.d = pDVar8;
    pDVar11[-1].abbreviation.d.ptr = pcVar9;
    pDVar11[-1].abbreviation.d.size = qVar10;
    pDVar11[-1].atMSecsSinceEpoch = lVar7;
    pDVar11[-1].offsetFromUtc = iVar3;
    pDVar11[-1].standardTimeOffset = iVar4;
    pDVar11[-1].daylightTimeOffset = iVar3 - iVar4;
    ppDVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
               super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    *ppDVar1 = *ppDVar1 + -1;
  }
  else {
    pDVar2 = pDVar11 + i;
    memmove(pDVar2 + 1,pDVar11 + i,
            ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.size - i) * 0x30);
    (pDVar2->abbreviation).d.d = pDVar8;
    (pDVar2->abbreviation).d.ptr = pcVar9;
    (pDVar2->abbreviation).d.size = qVar10;
    pDVar2->atMSecsSinceEpoch = lVar7;
    pDVar2->offsetFromUtc = iVar3;
    pDVar2->standardTimeOffset = iVar4;
    pDVar2->daylightTimeOffset = iVar3 - iVar4;
  }
LAB_00410172:
  pqVar12 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }